

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderVariableManagerGL.cpp
# Opt level: O3

void __thiscall
Diligent::ShaderVariableManagerGL::CheckResources
          (ShaderVariableManagerGL *this,IResourceMapping *pResourceMapping,
          BIND_SHADER_RESOURCES_FLAGS Flags,SHADER_RESOURCE_VARIABLE_TYPE_FLAGS *StaleVarTypes)

{
  ushort uVar1;
  ShaderVariableBase<Diligent::ShaderVariableManagerGL::UniformBuffBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
  *this_00;
  ShaderVariableBase<Diligent::ShaderVariableManagerGL::TextureBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
  *this_01;
  ShaderVariableBase<Diligent::ShaderVariableManagerGL::ImageBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
  *this_02;
  ShaderVariableBase<Diligent::ShaderVariableManagerGL::StorageBufferBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
  *this_03;
  ulong uVar2;
  BIND_SHADER_RESOURCES_FLAGS Flags_00;
  ulong uVar3;
  Uint32 UVar4;
  uint uVar5;
  
  Flags_00 = Flags | BIND_SHADER_RESOURCES_UPDATE_ALL;
  if ((Flags & BIND_SHADER_RESOURCES_UPDATE_ALL) != 0) {
    Flags_00 = Flags;
  }
  uVar5 = (uint)(((this->super_ShaderVariableManagerBase<Diligent::EngineGLImplTraits,_void>).
                 m_ResourceCache)->m_ContentType == SRB) * 5 + 1;
  uVar1 = this->m_TextureOffset;
  if (0x17 < uVar1) {
    UVar4 = 0;
    do {
      this_00 = (ShaderVariableBase<Diligent::ShaderVariableManagerGL::UniformBuffBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
                 *)GetConstResource<Diligent::ShaderVariableManagerGL::UniformBuffBindInfo>
                             (this,UVar4);
      ShaderVariableBase<Diligent::ShaderVariableManagerGL::UniformBuffBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
      ::CheckResources(this_00,pResourceMapping,Flags_00,StaleVarTypes);
      if ((uVar5 & ~*StaleVarTypes) == 0) {
        return;
      }
      UVar4 = UVar4 + 1;
      uVar1 = this->m_TextureOffset;
    } while (UVar4 < uVar1 / 0x18);
  }
  uVar2 = (ulong)this->m_ImageOffset;
  if ((int)((uVar2 - uVar1) / 0x18) != 0) {
    UVar4 = 0;
    do {
      this_01 = (ShaderVariableBase<Diligent::ShaderVariableManagerGL::TextureBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
                 *)GetConstResource<Diligent::ShaderVariableManagerGL::TextureBindInfo>(this,UVar4);
      ShaderVariableBase<Diligent::ShaderVariableManagerGL::TextureBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
      ::CheckResources(this_01,pResourceMapping,Flags_00,StaleVarTypes);
      if ((uVar5 & ~*StaleVarTypes) == 0) {
        return;
      }
      uVar2 = (ulong)this->m_ImageOffset;
      UVar4 = UVar4 + 1;
    } while (UVar4 < (uint)((uVar2 - this->m_TextureOffset) / 0x18));
  }
  uVar3 = (ulong)this->m_StorageBufferOffset;
  if ((int)((uVar3 - uVar2) / 0x18) != 0) {
    UVar4 = 0;
    do {
      this_02 = (ShaderVariableBase<Diligent::ShaderVariableManagerGL::ImageBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
                 *)GetConstResource<Diligent::ShaderVariableManagerGL::ImageBindInfo>(this,UVar4);
      ShaderVariableBase<Diligent::ShaderVariableManagerGL::ImageBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
      ::CheckResources(this_02,pResourceMapping,Flags_00,StaleVarTypes);
      if ((uVar5 & ~*StaleVarTypes) == 0) {
        return;
      }
      uVar3 = (ulong)this->m_StorageBufferOffset;
      UVar4 = UVar4 + 1;
    } while (UVar4 < (uint)((uVar3 - this->m_ImageOffset) / 0x18));
  }
  if ((int)((this->m_VariableEndOffset - uVar3) / 0x18) != 0) {
    UVar4 = 0;
    do {
      this_03 = (ShaderVariableBase<Diligent::ShaderVariableManagerGL::StorageBufferBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
                 *)GetConstResource<Diligent::ShaderVariableManagerGL::StorageBufferBindInfo>
                             (this,UVar4);
      ShaderVariableBase<Diligent::ShaderVariableManagerGL::StorageBufferBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
      ::CheckResources(this_03,pResourceMapping,Flags_00,StaleVarTypes);
      if ((uVar5 & ~*StaleVarTypes) == 0) {
        return;
      }
      UVar4 = UVar4 + 1;
    } while (UVar4 < (uint)(((ulong)this->m_VariableEndOffset - (ulong)this->m_StorageBufferOffset)
                           / 0x18));
  }
  return;
}

Assistant:

void ShaderVariableManagerGL::CheckResources(IResourceMapping*                    pResourceMapping,
                                             BIND_SHADER_RESOURCES_FLAGS          Flags,
                                             SHADER_RESOURCE_VARIABLE_TYPE_FLAGS& StaleVarTypes) const
{
    if ((Flags & BIND_SHADER_RESOURCES_UPDATE_ALL) == 0)
        Flags |= BIND_SHADER_RESOURCES_UPDATE_ALL;

    const auto AllowedTypes = m_ResourceCache.GetContentType() == ResourceCacheContentType::SRB ?
        SHADER_RESOURCE_VARIABLE_TYPE_FLAG_MUT_DYN :
        SHADER_RESOURCE_VARIABLE_TYPE_FLAG_STATIC;

    HandleConstResources(
        [&](const UniformBuffBindInfo& ub) {
            ub.CheckResources(pResourceMapping, Flags, StaleVarTypes);
            return (StaleVarTypes & AllowedTypes) != AllowedTypes;
        },
        [&](const TextureBindInfo& tex) {
            tex.CheckResources(pResourceMapping, Flags, StaleVarTypes);
            return (StaleVarTypes & AllowedTypes) != AllowedTypes;
        },
        [&](const ImageBindInfo& img) {
            img.CheckResources(pResourceMapping, Flags, StaleVarTypes);
            return (StaleVarTypes & AllowedTypes) != AllowedTypes;
        },
        [&](const StorageBufferBindInfo& ssbo) {
            ssbo.CheckResources(pResourceMapping, Flags, StaleVarTypes);
            return (StaleVarTypes & AllowedTypes) != AllowedTypes;
        });
}